

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt_main.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  int iVar3;
  char *iface;
  int sig;
  ithread_t cmdloop_thread;
  sigset_t sigs_to_catch;
  uint local_b4;
  pthread_t local_b0;
  sigset_t local_a8;
  
  SampleUtil_Initialize(linux_print);
  if (argc < 2) {
    iface = (char *)0x0;
  }
  else {
    iVar3 = 1;
    iface = (char *)0x0;
    do {
      __s1 = argv[iVar3];
      if (((*__s1 == '-') && (__s1[1] == 'i')) && (__s1[2] == '\0')) {
        iVar2 = iVar3 + 1;
        iface = argv[(long)iVar3 + 1];
      }
      else {
        iVar1 = strcmp(__s1,"-help");
        iVar2 = iVar3;
        if (iVar1 == 0) {
          SampleUtil_Print("Usage: %s -i interface -help (this message)\n",*argv);
          SampleUtil_Print(
                          "\tinterface:     interface address of the control point\n\t\te.g.: eth0\n"
                          );
          return 1;
        }
      }
      iVar3 = iVar2 + 1;
    } while (iVar3 < argc);
  }
  iVar3 = TvCtrlPointStart(iface,(state_update)0x0,0);
  if (iVar3 == 0) {
    iVar2 = pthread_create(&local_b0,(pthread_attr_t *)0x0,TvCtrlPointCommandLoop,(void *)0x0);
    iVar3 = -0x38f;
    if (iVar2 == 0) {
      sigemptyset(&local_a8);
      sigaddset(&local_a8,2);
      sigwait(&local_a8,(int *)&local_b4);
      SampleUtil_Print("Shutting down on signal %d...\n",(ulong)local_b4);
      iVar3 = TvCtrlPointStop();
    }
  }
  else {
    SampleUtil_Print("Error starting UPnP TV Control Point\n");
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
	(void)argc;
	(void)argv;
	char *iface = NULL;
	int rc;
	ithread_t cmdloop_thread;
	int i = 0;
#ifdef _WIN32
#else
	int sig;
	sigset_t sigs_to_catch;
#endif
	int code;

	SampleUtil_Initialize(linux_print);
	/* Parse options */
	for (i = 1; i < argc; i++) {
		if (strcmp(argv[i], "-i") == 0) {
			iface = argv[++i];
		} else if (strcmp(argv[i], "-help") == 0) {
			SampleUtil_Print(
				"Usage: %s -i interface -help (this message)\n",
				argv[0]);
			SampleUtil_Print("\tinterface:     interface address "
					 "of the control point\n"
					 "\t\te.g.: eth0\n");
			return 1;
		}
	}

	rc = TvCtrlPointStart(iface, NULL, 0);
	if (rc != TV_SUCCESS) {
		SampleUtil_Print("Error starting UPnP TV Control Point\n");
		return rc;
	}
	/* start a command loop thread */
	code = ithread_create(
		&cmdloop_thread, NULL, TvCtrlPointCommandLoop, NULL);
	if (code != 0) {
		return UPNP_E_INTERNAL_ERROR;
	}
#ifdef _WIN32
	ithread_join(cmdloop_thread, NULL);
#else
	/* Catch Ctrl-C and properly shutdown */
	sigemptyset(&sigs_to_catch);
	sigaddset(&sigs_to_catch, SIGINT);
	sigwait(&sigs_to_catch, &sig);
	SampleUtil_Print("Shutting down on signal %d...\n", sig);
#endif
	rc = TvCtrlPointStop();

	return rc;
}